

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseGroup
          (UnknownFieldParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  int iVar1;
  uint32 uVar2;
  char *pcVar3;
  char *pcVar4;
  UnknownFieldParserHelper local_28;
  UnknownFieldParserHelper child;
  
  local_28.unknown_ = UnknownFieldSet::AddGroup(this->unknown_,num);
  iVar1 = ctx->depth_;
  ctx->depth_ = iVar1 + -1;
  if (iVar1 < 1) {
    pcVar4 = (char *)0x0;
  }
  else {
    ctx->group_depth_ = ctx->group_depth_ + 1;
    pcVar3 = WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                       (&local_28,ptr,ctx);
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar4 = (char *)0x0;
    if (uVar2 == num * 8 + 3) {
      pcVar4 = pcVar3;
    }
  }
  return pcVar4;
}

Assistant:

const char* ParseGroup(uint32 num, const char* ptr, ParseContext* ctx) {
    UnknownFieldParserHelper child(unknown_->AddGroup(num));
    return ctx->ParseGroup(&child, ptr, num * 8 + 3);
  }